

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O1

bool __thiscall
ritobin::io::impl_binary_read::BinBinaryReader::read_value_visit(BinBinaryReader *this,Map *value)

{
  Type *pTVar1;
  pointer *ppPVar2;
  Type TVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  BinCompat *pBVar8;
  uint *puVar9;
  uint *pos;
  uint *puVar10;
  iterator __position;
  pointer pPVar11;
  char cVar12;
  bool bVar13;
  Category CVar14;
  ulong uVar15;
  byte unaff_BPL;
  char *start;
  bool bVar16;
  
  pcVar5 = (this->reader).cur_;
  if ((this->reader).cap_ < pcVar5 + 1) {
    cVar12 = '\0';
  }
  else {
    cVar12 = *pcVar5;
    (this->reader).cur_ = pcVar5 + 1;
    pBVar8 = (this->reader).compat_;
    cVar12 = (**(code **)(*(long *)pBVar8 + 0x10))(pBVar8,cVar12,value);
  }
  if (cVar12 == '\0') {
    unaff_BPL = fail_msg(this,"reader.read(value.keyType)",pcVar5);
  }
  else {
    TVar3 = value->keyType;
    if ((char)TVar3 < '\0') {
      unaff_BPL = fail_msg(this,"ValueHelper::is_primitive(value.keyType)",(this->reader).cur_);
    }
    if (-1 < (char)TVar3) {
      pcVar6 = (this->reader).cur_;
      pcVar7 = (this->reader).cap_;
      pcVar5 = pcVar6 + 1;
      if (pcVar7 < pcVar5) {
        cVar12 = '\0';
      }
      else {
        cVar12 = *pcVar6;
        (this->reader).cur_ = pcVar5;
      }
      pTVar1 = &value->valueType;
      if (pcVar7 < pcVar5) {
        cVar12 = '\0';
      }
      else {
        pBVar8 = (this->reader).compat_;
        cVar12 = (**(code **)(*(long *)pBVar8 + 0x10))(pBVar8,cVar12,pTVar1);
      }
      if (cVar12 == '\0') {
        unaff_BPL = fail_msg(this,"reader.read(value.valueType)",pcVar6);
      }
      else {
        pcVar5 = (this->reader).cur_;
        CVar14 = ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
                 ::type_to_category(*pTVar1);
        if (CVar14 - OPTION < 3) {
          unaff_BPL = fail_msg(this,"!ValueHelper::is_container(value.valueType)",pcVar5);
        }
        else {
          puVar9 = (uint *)(this->reader).cur_;
          if ((this->reader).cap_ < puVar9 + 1) {
            unaff_BPL = fail_msg(this,"reader.read(size)",(char *)puVar9);
          }
          else {
            uVar4 = *puVar9;
            (this->reader).cur_ = (char *)(puVar9 + 1);
            pos = (uint *)(this->reader).cur_;
            puVar9 = pos + 1;
            puVar10 = (uint *)(this->reader).cap_;
            if (puVar10 < puVar9) {
              uVar15 = 0;
            }
            else {
              uVar15 = (ulong)*pos;
              (this->reader).cur_ = (char *)puVar9;
            }
            pcVar5 = (this->reader).beg_;
            if (puVar10 < puVar9) {
              unaff_BPL = fail_msg(this,"reader.read(count)",(char *)pos);
            }
            else {
              bVar16 = uVar15 == 0;
              if (!bVar16) {
                do {
                  __position._M_current =
                       (value->items).
                       super__Vector_base<ritobin::Pair,_std::allocator<ritobin::Pair>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (__position._M_current ==
                      (value->items).
                      super__Vector_base<ritobin::Pair,_std::allocator<ritobin::Pair>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<ritobin::Pair,_std::allocator<ritobin::Pair>_>::_M_realloc_insert<>
                              (&value->items,__position);
                  }
                  else {
                    memset(__position._M_current,0,0x90);
                    ppPVar2 = &(value->items).
                               super__Vector_base<ritobin::Pair,_std::allocator<ritobin::Pair>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
                    *ppPVar2 = *ppPVar2 + 1;
                  }
                  pPVar11 = (value->items).
                            super__Vector_base<ritobin::Pair,_std::allocator<ritobin::Pair>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                  pcVar6 = (this->reader).cur_;
                  bVar13 = read_value_of(this,&pPVar11[-1].key,value->keyType);
                  if (bVar13) {
                    pcVar6 = (this->reader).cur_;
                    bVar13 = read_value_of(this,&pPVar11[-1].value,*pTVar1);
                    if (!bVar13) {
                      unaff_BPL = fail_msg(this,"read_value_of(item, value.valueType)",pcVar6);
                    }
                  }
                  else {
                    unaff_BPL = fail_msg(this,"read_value_of(key, value.keyType)",pcVar6);
                    bVar13 = false;
                  }
                  if (bVar13 == false) break;
                  uVar15 = uVar15 - 1;
                  bVar16 = uVar15 == 0;
                } while (!bVar16);
              }
              if ((bVar16) &&
                 (unaff_BPL = 1,
                 (long)(this->reader).cur_ - (long)(this->reader).beg_ !=
                 (long)pos + ((ulong)uVar4 - (long)pcVar5))) {
                bVar16 = fail_msg(this,"reader.position() == position + size",(this->reader).cur_);
                return bVar16;
              }
            }
          }
        }
      }
    }
  }
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool read_value_visit(Map& value) noexcept {
            uint32_t size = 0;
            uint32_t count = 0;
            bin_assert(reader.read(value.keyType));
            bin_assert(ValueHelper::is_primitive(value.keyType));
            bin_assert(reader.read(value.valueType));
            bin_assert(!ValueHelper::is_container(value.valueType));
            bin_assert(reader.read(size));
            size_t position = reader.position();
            bin_assert(reader.read(count));
            for (size_t i = 0; i != count; i++) {
                auto& [key, item] = value.items.emplace_back();
                bin_assert(read_value_of(key, value.keyType));
                bin_assert(read_value_of(item, value.valueType));
            }
            bin_assert(reader.position() == position + size);
            return true;
        }